

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opbehavior.cc
# Opt level: O1

uintb __thiscall
OpBehavior::recoverInputBinary
          (OpBehavior *this,int4 slot,int4 sizeout,uintb out,int4 sizein,uintb in)

{
  LowlevelError *this_00;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  string local_40;
  
  this_00 = (LowlevelError *)
            __cxa_allocate_exception
                      (0x20,CONCAT44(in_register_00000034,slot),
                       CONCAT44(in_register_00000014,sizeout));
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot recover input parameter without loss of information","");
  LowlevelError::LowlevelError(this_00,&local_40);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

uintb OpBehavior::recoverInputBinary(int4 slot,int4 sizeout,uintb out,int4 sizein,uintb in) const

{
  throw LowlevelError("Cannot recover input parameter without loss of information");
}